

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O2

uint __thiscall
CyclicHash<unsigned_int,unsigned_char>::
hash<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
          (CyclicHash<unsigned_int,unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  
  puVar1 = (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)(c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar3) break;
    uVar2 = (uVar2 >> ((char)*(undefined4 *)(this + 8) - 1U & 0x1f) |
            (*(uint *)(this + 0x40c) & uVar2) * 2) ^
            *(uint *)(this + (ulong)puVar1[uVar3] * 4 + 0xc);
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }